

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::UniversalTersePrinter<const_char_*>::Print(char *str,ostream *os)

{
  allocator<char> local_31;
  string local_30;
  
  if (str != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,str,&local_31);
    PrintStringTo(&local_30,os);
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  std::operator<<(os,"NULL");
  return;
}

Assistant:

static void Print(const char* str, ::std::ostream* os) {
    if (str == nullptr) {
      *os << "NULL";
    } else {
      UniversalPrint(std::string(str), os);
    }
  }